

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cc
# Opt level: O0

int set_method(void **out_member,void *method,size_t method_size,size_t compiled_size)

{
  openssl_method_common_st *common;
  size_t compiled_size_local;
  size_t method_size_local;
  void *method_local;
  void **out_member_local;
  
  if ((method_size == compiled_size) && (*(char *)((long)method + 4) != '\0')) {
    *out_member = method;
    out_member_local._4_4_ = 1;
  }
  else {
    out_member_local._4_4_ = 0;
  }
  return out_member_local._4_4_;
}

Assistant:

static int set_method(void **out_member, const void *method, size_t method_size,
                      size_t compiled_size) {
  const struct openssl_method_common_st *common =
      reinterpret_cast<const openssl_method_common_st *>(method);
  if (method_size != compiled_size || !common->is_static) {
    return 0;
  }

  *out_member = (void *)method;
  return 1;
}